

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_settable(lua_State *L,int idx)

{
  TValue *t_00;
  StkId t;
  int idx_local;
  lua_State *L_local;
  
  t_00 = index2adr(L,idx);
  luaV_settable(L,t_00,L->top + -2,L->top + -1);
  L->top = L->top + -2;
  return;
}

Assistant:

LUA_API void lua_settable (lua_State *L, int idx) {
  StkId t;
  lua_lock(L);
  api_checknelems(L, 2);
  t = index2adr(L, idx);
  api_checkvalidindex(L, t);
  luaV_settable(L, t, L->top - 2, L->top - 1);
  L->top -= 2;  /* pop index and value */
  lua_unlock(L);
}